

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psac.cpp
# Opt level: O2

bool check_lcp_eq<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,true>
               (suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
                *sa,string *param_2,comm *c)

{
  bool bVar1;
  bool bVar2;
  string gstr;
  vector<unsigned_long,_std::allocator<unsigned_long>_> glcp;
  vector<char,_std::allocator<char>_> global_str_vec;
  vector<unsigned_long,_std::allocator<unsigned_long>_> gsa;
  vector<unsigned_long,_std::allocator<unsigned_long>_> gisa;
  string local_a8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  _Vector_base<char,_std::allocator<char>_> local_68;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  mxx::gatherv<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_50,&sa->local_SA,0,c);
  mxx::gatherv<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38,&sa->local_B,0,c);
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mxx::gatherv<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8,&sa->local_LCP,0,c);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88,&local_a8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8);
  mxx::gatherv<char>((vector<char,_std::allocator<char>_> *)&local_68,(param_2->_M_dataplus)._M_p,
                     param_2->_M_string_length,0,c);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::
  _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((string *)&local_a8,local_68._M_impl.super__Vector_impl_data._M_start,
             local_68._M_impl.super__Vector_impl_data._M_finish);
  bVar2 = true;
  if (c->m_rank == 0) {
    bVar1 = dss::check<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_a8._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(local_a8._M_dataplus._M_p + local_a8._M_string_length),
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_50);
    if (c->m_rank == 0) {
      bVar2 = check_lcp<unsigned_long>
                        (&local_a8,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_50,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88);
    }
  }
  else {
    bVar1 = true;
  }
  std::__cxx11::string::~string((string *)&local_a8);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_68);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_88);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_38);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_50);
  return (bool)(bVar1 & bVar2);
}

Assistant:

bool check_lcp_eq(suffix_array<Iterator, index_t, _LCP>& sa, const std::string& local_str, const mxx::comm& c) {
    // gather LCP back to root process
    std::vector<index_t> gsa = mxx::gatherv(sa.local_SA, 0, c);
    std::vector<index_t> gisa = mxx::gatherv(sa.local_B, 0, c);
    std::vector<index_t> glcp;
    if (_LCP)
        glcp = mxx::gatherv(sa.local_LCP, 0, c);
    // gather string
    // TODO: use iterator or std::string version for mxx?
    std::vector<char> global_str_vec = mxx::gatherv(&(*local_str.begin()), local_str.size(), 0, c);
    std::string gstr(global_str_vec.begin(), global_str_vec.end());
    bool sa_correct = true;
    if (c.rank() == 0) {
        sa_correct = dss::check(gstr.begin(), gstr.end(), gsa);
    }

    // check LCP
    bool lcp_correct = true;
    if (_LCP) {
        if (c.rank() == 0) {
            lcp_correct = check_lcp(gstr, gsa, gisa, glcp);
        }
    }
    return sa_correct && lcp_correct;
}